

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::anon_unknown_6::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  pointer ppTVar1;
  TileBuffer *pTVar2;
  void *__stat_loc;
  
  IlmThread_2_5::Task::Task(&this->super_Task,group);
  (this->super_Task)._vptr_Task = (_func_int **)&PTR__TileBufferTask_0049da10;
  this->_ofd = ofd;
  ppTVar1 = (ofd->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __stat_loc = (void *)((long)(ofd->tileBuffers).
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
  pTVar2 = ppTVar1[(ulong)(long)number % (ulong)__stat_loc];
  this->_tileBuffer = pTVar2;
  IlmThread_2_5::Semaphore::wait((Semaphore *)&(pTVar2->_sem)._semaphore,__stat_loc);
  pTVar2 = this->_tileBuffer;
  pTVar2->dy = dx;
  pTVar2->lx = dy;
  pTVar2->ly = lx;
  *(int *)&pTVar2->hasException = ly;
  return;
}

Assistant:

TileBufferTask::TileBufferTask
    (TaskGroup *group,
     TiledOutputFile::Data *ofd,
     int number,
     int dx, int dy,
     int lx, int ly)
:
    Task (group),
    _ofd (ofd),
    _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}